

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall
asmjit::StringBuilder::_opVFormat(StringBuilder *this,uint32_t op,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  char buf [1024];
  
  vsnprintf(buf,0x400,fmt,ap);
  buf[0x3ff] = '\0';
  EVar1 = _opString(this,op,buf,0xffffffffffffffff);
  return EVar1;
}

Assistant:

Error StringBuilder::_opVFormat(uint32_t op, const char* fmt, va_list ap) noexcept {
  char buf[1024];

  vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
  buf[ASMJIT_ARRAY_SIZE(buf) - 1] = '\0';

  return _opString(op, buf);
}